

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

bool __thiscall Render::loadResources(Render *this)

{
  undefined8 uVar1;
  SDL_Surface *pSVar2;
  int local_30;
  int local_2c;
  int j;
  int i;
  SDL_Rect r;
  Render *this_local;
  
  r._8_8_ = this;
  uVar1 = SDL_RWFromFile("res/cs8x8.bmp","rb");
  pSVar2 = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
  this->charset = pSVar2;
  if (this->charset == (SDL_Surface *)0x0) {
    printf("Cannot load: %s\n","res/cs8x8.bmp");
    this_local._7_1_ = false;
  }
  else {
    SDL_SetColorKey(this->charset,1,0);
    uVar1 = SDL_RWFromFile("res/tileset.bmp","rb");
    pSVar2 = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
    this->tileset = pSVar2;
    if (this->tileset == (SDL_Surface *)0x0) {
      printf("Cannot load: %s\n","res/tileset.bmp");
      this_local._7_1_ = false;
    }
    else {
      SDL_SetColorKey(this->tileset,1,0);
      uVar1 = SDL_RWFromFile("res/drums.bmp","rb");
      pSVar2 = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
      this->backgroundTile = pSVar2;
      if (this->backgroundTile == (SDL_Surface *)0x0) {
        printf("Cannot load: %s\n","res/drums.bmp");
        this_local._7_1_ = false;
      }
      else {
        this->startX = this->screen->w / 2 + -0x138;
        this->startY = 0x28;
        this->rows = (this->screen->h - this->startY) / 0x10 + 1;
        (this->fieldBG).x = this->startX;
        (this->fieldBG).y = this->startY;
        (this->fieldBG).w = 0x270;
        (this->fieldBG).h = this->rows << 4;
        Map::setField(this->map,(this->fieldBG).w + -0x38,(this->fieldBG).h + -0x10);
        pSVar2 = (SDL_Surface *)
                 SDL_CreateRGBSurface
                           (0,(this->fieldBG).w,(this->fieldBG).h,0x20,0xff0000,0xff00,0xff,
                            0xff000000);
        this->background = pSVar2;
        for (local_2c = 0; local_2c < (this->fieldBG).w / this->backgroundTile->w + 1;
            local_2c = local_2c + 1) {
          for (local_30 = 0; local_30 < (this->fieldBG).h / this->backgroundTile->h + 1;
              local_30 = local_30 + 1) {
            j = local_2c * this->backgroundTile->w;
            i = local_30 * this->backgroundTile->h;
            r.x = this->backgroundTile->w;
            r.y = this->backgroundTile->h;
            SDL_UpperBlit(this->backgroundTile,0,this->background,&j);
          }
        }
        parseTileset(this,this->tileset);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Render::loadResources(){
    // ASCII Charset
    charset = SDL_LoadBMP(RESOURCE_CHARSET);
    if(!charset){
        printf("Cannot load: %s\n", RESOURCE_CHARSET);
        return false;
    }
    SDL_SetColorKey(charset, true, 0x000000);

    // Tileset
    tileset = SDL_LoadBMP(RESOURCE_TILESET);
    if(!tileset){
        printf("Cannot load: %s\n", RESOURCE_TILESET);
        return false;
    }
    SDL_SetColorKey(tileset, true, 0x000000);

    // Background Tile
    backgroundTile = SDL_LoadBMP(RESOURCE_BACKGROUND);
    if(!backgroundTile){
        printf("Cannot load: %s\n", RESOURCE_BACKGROUND);
        return false;
    }

    // Calculate variables
    startX = screen->w/2 - ((BLOCKS_W+2)*BLOCK_W)/2;
    startY = 40;
    rows = (screen->h - startY)/BLOCK_H + 1;
    fieldBG.x = startX;
    fieldBG.y = startY;
    fieldBG.w = (BLOCKS_W+2)*BLOCK_W;
    fieldBG.h = (rows)*BLOCK_H;
    map->setField(fieldBG.w - 2*BLOCK_W - BALL_W, fieldBG.h - BLOCK_H);

    // Pre-render background
    SDL_Rect r;
    background = SDL_CreateRGBSurface(0, fieldBG.w, fieldBG.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
    for(int i=0; i<(fieldBG.w/backgroundTile->w + 1); i++)
        for(int j=0; j<(fieldBG.h/backgroundTile->h +1); j++){
            r.x = i*backgroundTile->w;
            r.y = j*backgroundTile->h;
            r.w = backgroundTile->w;
            r.h = backgroundTile->h;
            SDL_BlitSurface(backgroundTile, nullptr, background, &r);
        }

    parseTileset(tileset);

    return true;
}